

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.c
# Opt level: O0

void pcut_failed_assertion_fmt(char *filename,int line,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  long local_48;
  size_t offset;
  char *current_buffer;
  va_list args;
  char *fmt_local;
  int line_local;
  char *filename_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  offset = (size_t)(message_buffer + message_buffer_index);
  local_48 = 0;
  message_buffer_index = (message_buffer_index + 1) % 2;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  args[0].reg_save_area = fmt;
  pcut_snprintf((char *)offset,0x100,"%s:%d: ",filename,(ulong)(uint)line);
  iVar1 = pcut_str_size((char *)offset);
  local_48 = (long)iVar1;
  if (local_48 + 1U < 0x100) {
    args[0].overflow_arg_area = local_f8;
    args[0]._0_8_ = &stack0x00000008;
    current_buffer._4_4_ = 0x30;
    current_buffer._0_4_ = 0x18;
    vsnprintf((char *)(offset + local_48),0x100 - local_48,(char *)args[0].reg_save_area,
              &current_buffer);
  }
  pcut_failed_assertion((char *)offset);
  return;
}

Assistant:

void pcut_failed_assertion_fmt(const char *filename, int line, const char *fmt, ...) {
	va_list args;
	char *current_buffer = message_buffer[message_buffer_index];
	size_t offset = 0;
	message_buffer_index = (message_buffer_index + 1) % MESSAGE_BUFFER_COUNT;

	pcut_snprintf(current_buffer, MAX_MESSAGE_LENGTH, "%s:%d: ", filename, line);
	offset = pcut_str_size(current_buffer);

	if (offset + 1 < MAX_MESSAGE_LENGTH) {
		va_start(args, fmt);
		vsnprintf(current_buffer + offset, MAX_MESSAGE_LENGTH - offset, fmt, args);
		va_end(args);
	}

	pcut_failed_assertion(current_buffer);
}